

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

lzma_vli index_file_size(lzma_vli compressed_base,lzma_vli unpadded_sum,lzma_vli record_count,
                        lzma_vli index_list_size,lzma_vli stream_padding)

{
  uint32_t uVar1;
  lzma_vli lVar2;
  long lVar3;
  lzma_vli lVar4;
  long lVar5;
  
  if ((long)unpadded_sum < 0) {
LAB_001be73f:
    __assert_fail("vli <= LZMA_VLI_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Utilities/cmliblzma/liblzma/common/index.h"
                  ,0x29,"lzma_vli vli_ceil4(lzma_vli)");
  }
  lVar5 = compressed_base + stream_padding + (unpadded_sum + 3 & 0xfffffffffffffffc) + 0x18;
  if (lVar5 < 0) {
    lVar2 = 0xffffffffffffffff;
  }
  else {
    uVar1 = lzma_vli_size(record_count);
    lVar3 = index_list_size + (uVar1 + 1);
    if (lVar3 + 4 < 0) goto LAB_001be73f;
    lVar4 = (lVar3 + 7U & 0xfffffffffffffffc) + lVar5;
    lVar2 = 0xffffffffffffffff;
    if (-1 < (long)lVar4) {
      lVar2 = lVar4;
    }
  }
  return lVar2;
}

Assistant:

static lzma_vli
index_file_size(lzma_vli compressed_base, lzma_vli unpadded_sum,
		lzma_vli record_count, lzma_vli index_list_size,
		lzma_vli stream_padding)
{
	// Earlier Streams and Stream Paddings + Stream Header
	// + Blocks + Index + Stream Footer + Stream Padding
	//
	// This might go over LZMA_VLI_MAX due to too big unpadded_sum
	// when this function is used in lzma_index_append().
	lzma_vli file_size = compressed_base + 2 * LZMA_STREAM_HEADER_SIZE
			+ stream_padding + vli_ceil4(unpadded_sum);
	if (file_size > LZMA_VLI_MAX)
		return LZMA_VLI_UNKNOWN;

	// The same applies here.
	file_size += index_size(record_count, index_list_size);
	if (file_size > LZMA_VLI_MAX)
		return LZMA_VLI_UNKNOWN;

	return file_size;
}